

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# main.cpp
# Opt level: O0

void __thiscall Code_domain_impl::string_ref::string_ref(string_ref *this,char *str)

{
  pointer pcVar1;
  long lVar2;
  long lVar3;
  undefined1 local_30 [8];
  shared_ptr<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_> p;
  size_t len;
  char *str_local;
  string_ref *this_local;
  
  len = (size_t)str;
  str_local = (char *)this;
  system_error2::status_code_domain::string_ref::string_ref
            (&this->super_string_ref,_custom_string_thunk);
  p.
  super___shared_ptr<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_(__gnu_cxx::_Lock_policy)2>
  ._M_refcount._M_pi = (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)strlen((char *)len);
  std::make_shared<std::__cxx11::string,char_const*&,unsigned_long&>((char **)local_30,&len);
  std::shared_ptr<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
  ::shared_ptr((shared_ptr<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
                *)(this->super_string_ref)._state,
               (shared_ptr<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
                *)local_30);
  std::
  __shared_ptr_access<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_(__gnu_cxx::_Lock_policy)2,_false,_false>
  ::operator->((__shared_ptr_access<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_(__gnu_cxx::_Lock_policy)2,_false,_false>
                *)local_30);
  pcVar1 = (pointer)std::__cxx11::string::data();
  (this->super_string_ref)._begin = pcVar1;
  std::
  __shared_ptr_access<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_(__gnu_cxx::_Lock_policy)2,_false,_false>
  ::operator->((__shared_ptr_access<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_(__gnu_cxx::_Lock_policy)2,_false,_false>
                *)local_30);
  lVar2 = std::__cxx11::string::data();
  std::
  __shared_ptr_access<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_(__gnu_cxx::_Lock_policy)2,_false,_false>
  ::operator->((__shared_ptr_access<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_(__gnu_cxx::_Lock_policy)2,_false,_false>
                *)local_30);
  lVar3 = std::__cxx11::string::size();
  (this->super_string_ref)._end = (pointer)(lVar2 + lVar3);
  std::shared_ptr<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
  ::~shared_ptr((shared_ptr<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
                 *)local_30);
  return;
}

Assistant:

explicit string_ref(const char *str)
        : _base::string_ref(_custom_string_thunk)
    {
      static_assert(sizeof(shared_ptr_type) <= sizeof(this->_state), "A shared_ptr does not fit into status_code's state");
      auto len = strlen(str);
      auto p = std::make_shared<std::string>(str, len);
      new(reinterpret_cast<shared_ptr_type *>(this->_state)) shared_ptr_type(p);  // NOLINT
      this->_begin = p->data();
      this->_end = p->data() + p->size();                                         // NOLINT
    }